

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float ImGui::SliderCalcRatioFromValueT<unsigned_int,float>
                (ImGuiDataType data_type,uint v,uint v_min,uint v_max,float power,
                float linear_zero_pos)

{
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  int in_EDI;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float f_1;
  float f;
  uint v_clamped;
  bool is_power;
  uint local_34;
  bool local_2e;
  float local_4;
  
  if (in_EDX == in_ECX) {
    local_4 = 0.0;
  }
  else {
    local_2e = false;
    if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
      local_2e = in_EDI == 8 || in_EDI == 9;
    }
    if (in_EDX < in_ECX) {
      local_34 = ImClamp<unsigned_int>(in_ESI,in_EDX,in_ECX);
    }
    else {
      local_34 = ImClamp<unsigned_int>(in_ESI,in_ECX,in_EDX);
    }
    if (local_2e) {
      if (0.0 <= (float)local_34) {
        ImMax<unsigned_int>(0,in_EDX);
        ImMax<unsigned_int>(0,in_EDX);
        fVar1 = ImPow(0.0,3.360721e-39);
        local_4 = fVar1 * (1.0 - in_XMM1_Da) + in_XMM1_Da;
      }
      else {
        ImMin<unsigned_int>(0,in_ECX);
        fVar1 = ImPow(0.0,3.360506e-39);
        local_4 = (1.0 - fVar1) * in_XMM1_Da;
      }
    }
    else {
      local_4 = (float)(local_34 - in_EDX) / (float)(in_ECX - in_EDX);
    }
  }
  return local_4;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}